

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * sqlite3PExpr(Parse *pParse,int op,Expr *pLeft,Expr *pRight,Token *pToken)

{
  Expr *pRoot;
  
  if ((pRight == (Expr *)0x0 || pLeft == (Expr *)0x0) || op != 0x45) {
    pRoot = sqlite3ExprAlloc(pParse->db,op,pToken,1);
    sqlite3ExprAttachSubtrees(pParse->db,pRoot,pLeft,pRight);
  }
  else {
    pRoot = sqlite3ExprAnd(pParse->db,pLeft,pRight);
  }
  if ((pRoot != (Expr *)0x0) && (pParse->db->aLimit[3] < pRoot->nHeight)) {
    sqlite3ErrorMsg(pParse,"Expression tree is too large (maximum depth %d)");
  }
  return pRoot;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3PExpr(
  Parse *pParse,          /* Parsing context */
  int op,                 /* Expression opcode */
  Expr *pLeft,            /* Left operand */
  Expr *pRight,           /* Right operand */
  const Token *pToken     /* Argument token */
){
  Expr *p;
  if( op==TK_AND && pLeft && pRight ){
    /* Take advantage of short-circuit false optimization for AND */
    p = sqlite3ExprAnd(pParse->db, pLeft, pRight);
  }else{
    p = sqlite3ExprAlloc(pParse->db, op, pToken, 1);
    sqlite3ExprAttachSubtrees(pParse->db, p, pLeft, pRight);
  }
  if( p ) {
    sqlite3ExprCheckHeight(pParse, p->nHeight);
  }
  return p;
}